

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O1

void __thiscall
HookStateStepIn::ProcessHook
          (HookStateStepIn *this,shared_ptr<Debugger> *debugger,lua_State *L,lua_Debug *ar)

{
  Debugger *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  
  this_00 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if ((this->super_StackLevelBasedState).super_HookState.currentStateL == L) {
    iVar2 = Debugger::GetStackLevel(this_00,false);
    (this->super_StackLevelBasedState).newStackLevel = iVar2;
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  iVar2 = getDebugEvent(ar);
  if (iVar2 != 2) {
    p_Var1 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        return;
      }
    }
    return;
  }
  (*lua_getinfo)(L,"nSl",ar);
  iVar2 = getDebugCurrentLine(ar);
  getDebugSource(ar);
  if ((iVar2 == this->line) &&
     (iVar2 = std::__cxx11::string::compare((char *)&this->file), iVar2 == 0)) {
    return;
  }
  Debugger::HandleBreak((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  return;
}

Assistant:

void HookStateStepIn::ProcessHook(std::shared_ptr<Debugger> debugger, lua_State* L, lua_Debug* ar)
{
	UpdateStackLevel(debugger, L, ar);
	if (getDebugEvent(ar) == LUA_HOOKLINE)
	{
		lua_getinfo(L, "nSl", ar);
		auto currentLine = getDebugCurrentLine(ar);
		auto source = getDebugSource(ar);
		if(currentLine != line || file != source)
		{
			debugger->HandleBreak();
		}
		return;
	}

	StackLevelBasedState::ProcessHook(debugger, L, ar);
}